

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode multi_addtimeout(Curl_easy *data,timeval *stamp,expire_id eid)

{
  curl_llist_element *pcVar1;
  __suseconds_t _Var2;
  CURLMcode extraout_EAX;
  size_t sVar3;
  time_t tVar4;
  curl_llist *pcVar5;
  curl_llist *list;
  time_node *ne;
  curl_llist_element *e;
  
  ne = (data->state).expires + eid;
  list = &(data->state).timeoutlist;
  _Var2 = stamp->tv_usec;
  (data->state).expires[eid].time.tv_sec = stamp->tv_sec;
  (data->state).expires[eid].time.tv_usec = _Var2;
  (data->state).expires[eid].eid = eid;
  sVar3 = Curl_llist_count(list);
  if (sVar3 == 0) {
    e = (curl_llist_element *)0x0;
  }
  else {
    pcVar5 = list;
    pcVar1 = (curl_llist_element *)0x0;
    do {
      e = pcVar1;
      pcVar1 = pcVar5->head;
      if (pcVar1 == (curl_llist_element *)0x0) break;
      tVar4 = curlx_tvdiff(*(timeval *)((long)pcVar1->ptr + 0x18),(data->state).expires[eid].time);
      pcVar5 = (curl_llist *)&pcVar1->next;
    } while (tVar4 < 1);
  }
  Curl_llist_insert_next(list,e,ne,&ne->list);
  return extraout_EAX;
}

Assistant:

static CURLMcode
multi_addtimeout(struct Curl_easy *data,
                 struct timeval *stamp,
                 expire_id eid)
{
  struct curl_llist_element *e;
  struct time_node *node;
  struct curl_llist_element *prev = NULL;
  size_t n;
  struct curl_llist *timeoutlist = &data->state.timeoutlist;

  node = &data->state.expires[eid];

  /* copy the timestamp and id */
  memcpy(&node->time, stamp, sizeof(*stamp));
  node->eid = eid; /* also marks it as in use */

  n = Curl_llist_count(timeoutlist);
  if(n) {
    /* find the correct spot in the list */
    for(e = timeoutlist->head; e; e = e->next) {
      struct time_node *check = (struct time_node *)e->ptr;
      time_t diff = curlx_tvdiff(check->time, node->time);
      if(diff > 0)
        break;
      prev = e;
    }

  }
  /* else
     this is the first timeout on the list */

  Curl_llist_insert_next(timeoutlist, prev, node, &node->list);
  return CURLM_OK;
}